

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O0

size_t bpkiShareEnc(octet *pki,octet *share,size_t share_len)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long in_RDX;
  long in_RDI;
  size_t t_9;
  size_t t_8;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  size_t count;
  der_anchor_t BelsAlgId [1];
  der_anchor_t PKI [1];
  size_t in_stack_fffffffffffffef8;
  octet *in_stack_ffffffffffffff00;
  der_anchor_t *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  der_anchor_t *in_stack_ffffffffffffff18;
  der_anchor_t *in_stack_ffffffffffffff20;
  der_anchor_t *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  u32 uVar6;
  octet *in_stack_ffffffffffffff38;
  long local_c0;
  long local_b8;
  long local_60;
  der_anchor_t *local_8;
  
  uVar6 = (u32)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  sVar1 = derTSEQEncStart(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,0);
  if (in_RDI == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = in_RDI + sVar1;
  }
  sVar2 = derTSIZEEnc(in_stack_ffffffffffffff38,uVar6,(size_t)in_stack_ffffffffffffff28);
  if (local_b8 == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = local_b8 + sVar2;
  }
  sVar3 = derTSEQEncStart(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,0);
  if (local_c0 == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = local_c0 + sVar3;
  }
  sVar4 = derOIDEnc((octet *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  if (local_c0 == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = local_c0 + sVar4;
  }
  if (in_RDX == 0x11) {
    sVar5 = derOIDEnc((octet *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (local_c0 == 0) {
      in_stack_ffffffffffffff28 = (der_anchor_t *)0x0;
      local_8 = in_stack_ffffffffffffff28;
    }
    else {
      in_stack_ffffffffffffff28 = (der_anchor_t *)(local_c0 + sVar5);
      local_8 = in_stack_ffffffffffffff28;
    }
  }
  else if (in_RDX == 0x19) {
    sVar5 = derOIDEnc((octet *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (local_c0 == 0) {
      in_stack_ffffffffffffff20 = (der_anchor_t *)0x0;
      local_8 = in_stack_ffffffffffffff20;
    }
    else {
      in_stack_ffffffffffffff20 = (der_anchor_t *)(local_c0 + sVar5);
      local_8 = in_stack_ffffffffffffff20;
    }
  }
  else {
    sVar5 = derOIDEnc((octet *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (local_c0 == 0) {
      in_stack_ffffffffffffff18 = (der_anchor_t *)0x0;
      local_8 = in_stack_ffffffffffffff18;
    }
    else {
      in_stack_ffffffffffffff18 = (der_anchor_t *)(local_c0 + sVar5);
      local_8 = in_stack_ffffffffffffff18;
    }
  }
  local_60 = sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
  sVar1 = derTSEQEncStop((octet *)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18);
  if (local_8 == (der_anchor_t *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (u32)((long)&local_8->der + sVar1 >> 0x20);
  }
  sVar2 = derEnc((octet *)in_stack_ffffffffffffff18,uVar6,in_stack_ffffffffffffff08,
                 (size_t)in_stack_ffffffffffffff00);
  sVar3 = derTSEQEncStop((octet *)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18);
  return sVar3 + sVar2 + sVar1 + local_60;
}

Assistant:

static size_t bpkiShareEnc(octet pki[], const octet share[], size_t share_len)
{
	der_anchor_t PKI[1];
	der_anchor_t BelsAlgId[1];
	size_t count = 0;
	// проверить ключи
	ASSERT(share_len == 17 || share_len == 25 || share_len == 33);
	ASSERT(memIsNullOrValid(share, share_len));
	ASSERT(!share || 1 <= share[0] && share[0] <= 16);
	// кодировать
	derEncStep(derSEQEncStart(PKI, pki, count), pki, count);
	 derEncStep(derSIZEEnc(pki, 0), pki, count);
	 derEncStep(derSEQEncStart(BelsAlgId, pki, count), pki, count);
	  derEncStep(derOIDEnc(pki, oid_bels_share), pki, count);
	  if (share_len == 17)
		  derEncStep(derOIDEnc(pki, oid_bels_m0128v1), pki, count);
	  else if (share_len == 25)
		  derEncStep(derOIDEnc(pki, oid_bels_m0192v1), pki, count);
	  else
		  derEncStep(derOIDEnc(pki, oid_bels_m0256v1), pki, count);
	 derEncStep(derSEQEncStop(pki, count, BelsAlgId), pki, count);
	 derEncStep(derOCTEnc(pki, share, share_len), pki, count);
	derEncStep(derSEQEncStop(pki, count, PKI), pki, count);
	// возвратить длину DER-кода
	return count;
}